

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::
AllHigherDimensionSides
          (TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
           *this,int side,int targetdimension,TPZStack<TPZGeoElSide,_10> *elsides)

{
  int iVar1;
  int64_t iVar2;
  TPZGeoElSide *this_00;
  int *piVar3;
  int in_EDX;
  long *in_RDI;
  int size;
  int i;
  TPZStack<int,_10> highsides;
  TPZStack<int,_10> *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  TPZStack<int,_10> *in_stack_ffffffffffffff50;
  int local_70;
  TPZVec<int> local_60 [2];
  int local_10;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_10 = in_EDX;
  TPZStack<int,_10>::TPZStack(in_stack_ffffffffffffff50);
  pztopology::TPZTriangle::HigherDimensionSides(iVar1,in_stack_ffffffffffffff38);
  iVar2 = TPZVec<int>::NElements(local_60);
  for (local_70 = 0; local_70 < (int)iVar2; local_70 = local_70 + 1) {
    this_00 = (TPZGeoElSide *)TPZVec<int>::operator[](local_60,(long)local_70);
    iVar1 = (**(code **)(*in_RDI + 0x208))
                      (in_RDI,*(int *)&(this_00->super_TPZSavable)._vptr_TPZSavable);
    if (iVar1 == local_10) {
      piVar3 = TPZVec<int>::operator[](local_60,(long)local_70);
      TPZGeoElSide::TPZGeoElSide
                (this_00,(TPZGeoEl *)CONCAT44(iVar1,in_stack_ffffffffffffff48),
                 (int)((ulong)piVar3 >> 0x20));
      TPZStack<TPZGeoElSide,_10>::Push
                ((TPZStack<TPZGeoElSide,_10> *)this_00,
                 (TPZGeoElSide *)CONCAT44(iVar1,in_stack_ffffffffffffff48));
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x17dfd1d);
    }
  }
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x17dfd65);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::AllHigherDimensionSides(int side,int targetdimension,TPZStack<TPZGeoElSide> &elsides){
	TPZStack<int> highsides;
	TGeo::HigherDimensionSides(side,highsides);
	int i,size = highsides.NElements();
	for(i=0;i<size;i++) {
		if(SideDimension(highsides[i]) == targetdimension) {
			elsides.Push(TPZGeoElSide(this,highsides[i]));
		}
	}
}